

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiHand::HanabiHand
          (HanabiHand *this,HanabiHand *hand,bool hide_cards,bool hide_knowledge)

{
  bool bVar1;
  int iVar2;
  CardKnowledge *this_00;
  byte in_CL;
  byte in_DL;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *in_RSI;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff30;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *pvVar3;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff50;
  HanabiCard *in_stack_ffffffffffffff58;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_ffffffffffffffc8;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_ffffffffffffffd0;
  HanabiCard local_20;
  byte local_12;
  byte local_11;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_10 = in_RSI;
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          *)0x146500);
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::vector((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
            *)0x146513);
  if ((local_11 & 1) == 0) {
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    in_stack_ffffffffffffff50 =
         (value_type *)
         std::
         vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
         size(local_10);
    local_20.color_ = 0;
    local_20.rank_ = 0;
    in_stack_ffffffffffffff58 = &local_20;
    HanabiCard::HanabiCard(in_stack_ffffffffffffff58);
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    resize(in_RDI,(size_type)in_stack_ffffffffffffff58,(value_type *)in_stack_ffffffffffffff50);
  }
  if (((local_12 & 1) != 0) &&
     (bVar1 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::empty(in_stack_ffffffffffffff40), !bVar1)) {
    pvVar3 = in_RDI + 1;
    this_00 = (CardKnowledge *)
              std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::size(local_10);
    std::
    vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
    ::operator[]((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
                  *)(local_10 + 1),0);
    CardKnowledge::NumColors((CardKnowledge *)0x1465f4);
    std::
    vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
    ::operator[]((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
                  *)(local_10 + 1),0);
    iVar2 = CardKnowledge::NumRanks((CardKnowledge *)0x146617);
    CardKnowledge::CardKnowledge(this_00,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3);
    std::
    vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
    ::resize((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
              *)in_RDI,(size_type)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    CardKnowledge::~CardKnowledge((CardKnowledge *)CONCAT44(iVar2,in_stack_ffffffffffffff30));
    return;
  }
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::operator=((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               *)in_stack_ffffffffffffffd0,
              (vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

HanabiHand::HanabiHand(const HanabiHand& hand, bool hide_cards,
                       bool hide_knowledge) {
  if (hide_cards) {
    cards_.resize(hand.cards_.size(), HanabiCard());
  } else {
    cards_ = hand.cards_;
  }
  if (hide_knowledge && !hand.cards_.empty()) {
    card_knowledge_.resize(hand.cards_.size(),
                           CardKnowledge(hand.card_knowledge_[0].NumColors(),
                                         hand.card_knowledge_[0].NumRanks()));
  } else {
    card_knowledge_ = hand.card_knowledge_;
  }
}